

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_wrapper_dump(char *filename)

{
  ulong uVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  long lVar4;
  
  __stream = fopen(filename,"w");
  if (__stream != (FILE *)0x0) {
    lVar4 = 0x14;
    iVar2 = stb__alloc_size;
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      uVar1 = *(ulong *)((long)stb__allocations + lVar4 + -0x14);
      if (1 < uVar1) {
        fprintf(__stream,"%p %7d - %4d %s\n",uVar1,
                (ulong)*(uint *)((long)&stb__allocations->p + lVar4),
                (ulong)*(uint *)((long)stb__allocations + lVar4 + -4),
                *(undefined8 *)((long)stb__allocations + lVar4 + -0xc));
        iVar2 = stb__alloc_size;
      }
      lVar4 = lVar4 + 0x18;
    }
  }
  return;
}

Assistant:

void stb_wrapper_dump(char *filename)
{
   int i;
   FILE *f = fopen(filename, "w");
   if (!f) return;
   for (i=0; i < stb__alloc_size; ++i)
      if (stb__allocations[i].p > STB_DEL)
         fprintf(f, "%p %7d - %4d %s\n",
            stb__allocations[i].p   , stb__allocations[i].size,
            stb__allocations[i].line, stb__allocations[i].file);
}